

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O1

void ihevc_sao_band_offset_chroma
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,WORD32 sao_band_pos_u,WORD32 sao_band_pos_v,
               WORD8 *pi1_sao_offset_u,WORD8 *pi1_sao_offset_v,WORD32 wd,WORD32 ht)

{
  int iVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  UWORD8 *pUVar6;
  WORD8 *pWVar7;
  bool bVar8;
  int local_138 [46];
  WORD32 band_table_v [32];
  
  lVar2 = (long)wd;
  if (0 < ht) {
    pUVar6 = pu1_src + lVar2 + -1;
    uVar4 = 0;
    do {
      pu1_src_left[uVar4 * 2] = pUVar6[-1];
      pu1_src_left[uVar4 * 2 + 1] = *pUVar6;
      uVar4 = uVar4 + 1;
      pUVar6 = pUVar6 + src_strd;
    } while ((uint)ht != uVar4);
  }
  *pu1_src_top_left = pu1_src_top[lVar2 + -2];
  pu1_src_top_left[1] = pu1_src_top[lVar2 + -1];
  if (0 < wd) {
    uVar4 = 0;
    do {
      pu1_src_top[uVar4] = pu1_src[uVar4 + (long)((ht + -1) * src_strd)];
      uVar4 = uVar4 + 1;
    } while ((uint)wd != uVar4);
  }
  band_table_v[0xe] = 0;
  band_table_v[0xf] = 0;
  band_table_v[0x10] = 0;
  band_table_v[0x11] = 0;
  band_table_v[10] = 0;
  band_table_v[0xb] = 0;
  band_table_v[0xc] = 0;
  band_table_v[0xd] = 0;
  band_table_v[6] = 0;
  band_table_v[7] = 0;
  band_table_v[8] = 0;
  band_table_v[9] = 0;
  band_table_v[2] = 0;
  band_table_v[3] = 0;
  band_table_v[4] = 0;
  band_table_v[5] = 0;
  local_138[0x2c] = 0;
  local_138[0x2d] = 0;
  band_table_v[0] = 0;
  band_table_v[1] = 0;
  local_138[0x28] = 0;
  local_138[0x29] = 0;
  local_138[0x2a] = 0;
  local_138[0x2b] = 0;
  local_138[0x24] = 0;
  local_138[0x25] = 0;
  local_138[0x26] = 0;
  local_138[0x27] = 0;
  local_138[0x20] = 0;
  local_138[0x21] = 0;
  local_138[0x22] = 0;
  local_138[0x23] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  iVar1 = 1;
  do {
    local_138[(ulong)(sao_band_pos_u & 0x1f) + 0x20] = iVar1;
    local_138[sao_band_pos_v & 0x1f] = iVar1;
    sao_band_pos_v = sao_band_pos_v + 1;
    sao_band_pos_u = sao_band_pos_u + 1;
    iVar1 = iVar1 + 1;
  } while (iVar1 != 5);
  if (0 < ht) {
    iVar1 = 0;
    do {
      if (0 < wd) {
        uVar4 = 0;
        do {
          bVar8 = (uVar4 & 1) == 0;
          pWVar7 = pi1_sao_offset_v;
          if (bVar8) {
            pWVar7 = pi1_sao_offset_u;
          }
          piVar5 = local_138;
          if (bVar8) {
            piVar5 = local_138 + 0x20;
          }
          iVar3 = (int)pWVar7[piVar5[pu1_src[uVar4] >> 3]] + (uint)pu1_src[uVar4];
          if (iVar3 < 1) {
            iVar3 = 0;
          }
          if (0xfe < iVar3) {
            iVar3 = 0xff;
          }
          pu1_src[uVar4] = (UWORD8)iVar3;
          uVar4 = uVar4 + 1;
        } while ((uint)wd != uVar4);
      }
      pu1_src = pu1_src + src_strd;
      iVar1 = iVar1 + 1;
    } while (iVar1 != ht);
  }
  return;
}

Assistant:

void ihevc_sao_band_offset_chroma(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  WORD32 sao_band_pos_u,
                                  WORD32 sao_band_pos_v,
                                  WORD8 *pi1_sao_offset_u,
                                  WORD8 *pi1_sao_offset_v,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 band_shift;
    WORD32 band_table_u[NUM_BAND_TABLE];
    WORD32 band_table_v[NUM_BAND_TABLE];
    WORD32 i;
    WORD32 row, col;

    /* Updating left and top and top-left */
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[2 * row] = pu1_src[row * src_strd + (wd - 2)];
        pu1_src_left[2 * row + 1] = pu1_src[row * src_strd + (wd - 1)];
    }
    pu1_src_top_left[0] = pu1_src_top[wd - 2];
    pu1_src_top_left[1] = pu1_src_top[wd - 1];
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    band_shift = BIT_DEPTH_CHROMA - 5;
    for(i = 0; i < NUM_BAND_TABLE; i++)
    {
        band_table_u[i] = 0;
        band_table_v[i] = 0;
    }
    for(i = 0; i < 4; i++)
    {
        band_table_u[(i + sao_band_pos_u) & 31] = i + 1;
        band_table_v[(i + sao_band_pos_v) & 31] = i + 1;
    }

    for(row = 0; row < ht; row++)
    {
        for(col = 0; col < wd; col++)
        {
            WORD32 band_idx;
            WORD8 *pi1_sao_offset;

            pi1_sao_offset = (0 == col % 2) ? pi1_sao_offset_u : pi1_sao_offset_v;
            band_idx = (0 == col % 2) ? band_table_u[pu1_src[col] >> band_shift] : band_table_v[pu1_src[col] >> band_shift];
            pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[band_idx], 0, (1 << (band_shift + 5)) - 1);
        }
        pu1_src += src_strd;
    }
}